

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

istream * operator>>(istream *is,Date *dd)

{
  istream *piVar1;
  char ch4;
  char ch3;
  char ch2;
  char ch1;
  int d;
  int m;
  int y;
  char local_30;
  char local_2f;
  char local_2e;
  char local_2d;
  uint32_t local_2c;
  Month local_28;
  uint32_t local_24;
  Date local_20;
  
  piVar1 = std::operator>>(is,&local_2d);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,(int *)&local_24);
  piVar1 = std::operator>>(piVar1,&local_2e);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,(int *)&local_28);
  piVar1 = std::operator>>(piVar1,&local_2f);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,(int *)&local_2c);
  std::operator>>(piVar1,&local_30);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    if ((((local_2d == '(') && (local_2e == ',')) && (local_2f == ',')) && (local_30 == ')')) {
      Date::Date(&local_20,local_24,local_28,local_2c);
      dd->days = (long)local_20;
    }
    else {
      std::ios::clear((int)*(long *)(*(long *)is + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Date& dd)
{
	int y, m, d;
	char ch1, ch2, ch3, ch4;
	is >> ch1 >> y >> ch2 >> m >> ch3 >> d >> ch4;
	if (!is) return is;
	if (ch1 != '(' || ch2 != ',' || ch3 != ',' || ch4 != ')') { // oops: format error
		is.clear(std::ios_base::failbit); // set the fail bit
		return is;
	}
	dd = Date(y, Month(m), d); // update dd
	return is;
}